

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

void __thiscall
units::uncertain_measurement::uncertain_measurement
          (uncertain_measurement *this,measurement *val,measurement *uncertainty_meas)

{
  unit uVar1;
  measurement *in_RDX;
  measurement *in_RSI;
  float *in_RDI;
  double dVar2;
  unit *desired_unit;
  
  dVar2 = measurement::value(in_RSI);
  *in_RDI = (float)dVar2;
  desired_unit = (unit *)(in_RDI + 1);
  measurement::units(in_RSI);
  dVar2 = measurement::value_as(in_RDX,desired_unit);
  desired_unit->multiplier_ = (float)dVar2;
  uVar1 = measurement::units(in_RSI);
  *(unit *)(in_RDI + 2) = uVar1;
  return;
}

Assistant:

explicit uncertain_measurement(
        const measurement& val,
        const measurement& uncertainty_meas) noexcept :
        value_(static_cast<float>(val.value())),
        uncertainty_(
            static_cast<float>(uncertainty_meas.value_as(val.units()))),
        units_(val.units())
    {
    }